

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiting.hh
# Opt level: O0

void __thiscall
tchecker::waiting::
fast_remove_waiting_t<tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
::remove_non_waiting_first
          (fast_remove_waiting_t<tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
           *this)

{
  bool bVar1;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
  *this_00;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  element_t *t;
  fast_remove_waiting_t<tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>_>
  *this_local;
  
  while( true ) {
    bVar1 = stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
            ::empty(&this->_w);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    this_00 = stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
              ::first(&this->_w);
    pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
             ::operator->(this_00);
    if ((pmVar2->
        super_node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>).
        super_node_t.super_element_t._status == WAITING) break;
    stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
    ::remove_first(&this->_w);
  }
  return;
}

Assistant:

void remove_non_waiting_first()
  {
    while (!_w.empty()) {
      typename W::element_t const & t = _w.first();
      if (t->_status == tchecker::waiting::WAITING)
        break;
      _w.remove_first();
    }
  }